

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  byte bVar1;
  LogMessage *other;
  string *psVar2;
  MethodOptions *pMVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x10be);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar2 = (string *)operator_new(0x20);
        (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
        psVar2->_M_string_length = 0;
        (psVar2->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar2;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      if (this->input_type_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar2 = (string *)operator_new(0x20);
        (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
        psVar2->_M_string_length = 0;
        (psVar2->field_2)._M_local_buf[0] = '\0';
        this->input_type_ = psVar2;
      }
      std::__cxx11::string::_M_assign((string *)this->input_type_);
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      if (this->output_type_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar2 = (string *)operator_new(0x20);
        (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
        psVar2->_M_string_length = 0;
        (psVar2->field_2)._M_local_buf[0] = '\0';
        this->output_type_ = psVar2;
      }
      std::__cxx11::string::_M_assign((string *)this->output_type_);
    }
    if ((from->_has_bits_[0] & 8) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
      if (this->options_ == (MethodOptions *)0x0) {
        pMVar3 = (MethodOptions *)operator_new(0x60);
        MethodOptions::MethodOptions(pMVar3);
        this->options_ = pMVar3;
      }
      pMVar3 = from->options_;
      if (pMVar3 == (MethodOptions *)0x0) {
        pMVar3 = *(MethodOptions **)(default_instance_ + 0x28);
      }
      MethodOptions::MergeFrom(this->options_,pMVar3);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const MethodDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_input_type()) {
      set_input_type(from.input_type());
    }
    if (from.has_output_type()) {
      set_output_type(from.output_type());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::MethodOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}